

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.h
# Opt level: O2

bool xemmai::t_type_of<long>::t_cast<int>::f_is(t_object *a_object)

{
  byte bVar1;
  
  if (a_object < (t_object *)0x5) {
    bVar1 = 8 >> ((byte)a_object & 0x1f);
  }
  else if (a_object->v_type->v_depth == 0) {
    bVar1 = 0;
  }
  else {
    bVar1 = (undefined8 *)a_object->v_type->v_ids[1] == &v__type_id<long>;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

static bool f_is(t_object* a_object)
		{
			if (!std::is_same_v<typename t_fundamental<T>::t_type, intptr_t>) return reinterpret_cast<uintptr_t>(a_object) >= c_tag__OBJECT && a_object->f_type()->f_derives<typename t_fundamental<T>::t_type>();
			switch (reinterpret_cast<uintptr_t>(a_object)) {
			case c_tag__INTEGER:
				return true;
			case c_tag__NULL:
			case c_tag__FALSE:
			case c_tag__TRUE:
			case c_tag__FLOAT:
				return false;
			default:
				return a_object->f_type()->f_derives<intptr_t>();
			}
		}